

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.hpp
# Opt level: O1

void __thiscall BSDF::BSDF(BSDF *this,Json *conf)

{
  bool bVar1;
  const_reference pvVar2;
  Image *pIVar3;
  ScalarImage *pSVar4;
  vec3f vVar5;
  const_iterator result;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->_vptr_BSDF = (_func_int **)&PTR___cxa_pure_virtual_0016c2b0;
  this->albedoTexture = (Image *)0x0;
  this->bumpTexture = (ScalarImage *)0x0;
  (this->albedoConst).x = 1.0;
  (this->albedoConst).y = 1.0;
  (this->albedoConst).z = 1.0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[3]>
            ((const_iterator *)&local_c8,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [3])"Kd");
  local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_e8.m_it.array_iterator._M_current = (pointer)0x0;
  local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_e8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_e8.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_e8.m_it.primitive_iterator.m_it = 1;
  }
  local_e8.m_object = conf;
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_c8,&local_e8);
  if (!bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"Kd");
    if (pvVar2->m_type == string) {
      pIVar3 = (Image *)operator_new(0x10);
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"Kd");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_48,pvVar2);
      getpath(&local_c8,&local_48);
      Image::Image(pIVar3,&local_c8);
      this->albedoTexture = pIVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"Kd");
      vVar5 = json2vec3f(pvVar2);
      (this->albedoConst).x = (float)(int)vVar5._0_8_;
      (this->albedoConst).y = (float)(int)((ulong)vVar5._0_8_ >> 0x20);
      (this->albedoConst).z = vVar5.z;
    }
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[7]>
            ((const_iterator *)&local_c8,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [7])0x1556ac);
  local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_e8.m_it.array_iterator._M_current = (pointer)0x0;
  local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_e8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_e8.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_e8.m_it.primitive_iterator.m_it = 1;
  }
  local_e8.m_object = conf;
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_c8,&local_e8);
  if (!bVar1) {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"albedo");
    if (pvVar2->m_type == string) {
      pIVar3 = (Image *)operator_new(0x10);
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"albedo");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_68,pvVar2);
      getpath(&local_c8,&local_68);
      Image::Image(pIVar3,&local_c8);
      this->albedoTexture = pIVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"albedo");
      vVar5 = json2vec3f(pvVar2);
      (this->albedoConst).x = (float)(int)vVar5._0_8_;
      (this->albedoConst).y = (float)(int)((ulong)vVar5._0_8_ >> 0x20);
      (this->albedoConst).z = vVar5.z;
    }
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[5]>
            ((const_iterator *)&local_c8,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [5])"bump");
  local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_e8.m_it.array_iterator._M_current = (pointer)0x0;
  local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_e8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_e8.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_e8.m_it.primitive_iterator.m_it = 1;
  }
  local_e8.m_object = conf;
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_c8,&local_e8);
  if (!bVar1) {
    pSVar4 = (ScalarImage *)operator_new(0x10);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"bump");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_88,pvVar2);
    getpath(&local_c8,&local_88);
    ScalarImage::ScalarImage(pSVar4,&local_c8);
    this->bumpTexture = pSVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[8]>
            ((const_iterator *)&local_c8,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [8])"bumpmap");
  local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_e8.m_it.array_iterator._M_current = (pointer)0x0;
  local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_e8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_e8.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_e8.m_it.primitive_iterator.m_it = 1;
  }
  local_e8.m_object = conf;
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_c8,&local_e8);
  if (!bVar1) {
    pSVar4 = (ScalarImage *)operator_new(0x10);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"bumpmap");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_a8,pvVar2);
    getpath(&local_c8,&local_a8);
    ScalarImage::ScalarImage(pSVar4,&local_c8);
    this->bumpTexture = pSVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

BSDF(const Json& conf)
	{
		if (conf.find("Kd") != conf.end())
		{
			if (conf["Kd"].type() == Json::value_t::string)
				albedoTexture = new Image(getpath(conf["Kd"]));
			else
				albedoConst = json2vec3f(conf["Kd"]);
		}
		if (conf.find("albedo") != conf.end())
		{
			if (conf["albedo"].type() == Json::value_t::string)
				albedoTexture = new Image(getpath(conf["albedo"]));
			else
				albedoConst = json2vec3f(conf["albedo"]);
		}
		if (conf.find("bump") != conf.end())
		{
			bumpTexture = new ScalarImage(getpath(conf["bump"]));
		}
		if (conf.find("bumpmap") != conf.end())
		{
			bumpTexture = new ScalarImage(getpath(conf["bumpmap"]));
		}
	}